

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian.c
# Opt level: O2

void writeUint64InBigEndian(void *memory,uint64_t value)

{
  *(uint64_t *)memory =
       value >> 0x38 | (value & 0xff000000000000) >> 0x28 | (value & 0xff0000000000) >> 0x18 |
       (value & 0xff00000000) >> 8 | (value & 0xff000000) << 8 | (value & 0xff0000) << 0x18 |
       (value & 0xff00) << 0x28 | value << 0x38;
  return;
}

Assistant:

void writeUint64InBigEndian(void* memory, uint64_t value)
{
	uint8_t* p = memory;
	p[0] = (uint8_t)(value >> 56);
	p[1] = (uint8_t)(value >> 48);
	p[2] = (uint8_t)(value >> 40);
	p[3] = (uint8_t)(value >> 32);
	p[4] = (uint8_t)(value >> 24);
	p[5] = (uint8_t)(value >> 16);
	p[6] = (uint8_t)(value >> 8);
	p[7] = (uint8_t)(value);
}